

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall chrono::ChLoadJacobians::~ChLoadJacobians(ChLoadJacobians *this)

{
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->M);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->R);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->K);
  ChKblockGeneric::~ChKblockGeneric(&this->KRM);
  return;
}

Assistant:

class ChApi ChLoadJacobians {
  public:
    ChKblockGeneric KRM;        ///< sum of K,R,M, with pointers to sparse variables
    ChMatrixDynamic<double> K;  ///< dQ/dx
    ChMatrixDynamic<double> R;  ///< dQ/dv
    ChMatrixDynamic<double> M;  ///< dQ/da

    /// Set references to the constrained objects, each of ChVariables type,
    /// automatically creating/resizing K matrix if needed.
    void SetVariables(std::vector<ChVariables*> mvariables);
}